

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O3

PDFObject * __thiscall PDFObjectParser::ParseNewObject(PDFObjectParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type __n;
  bool bVar2;
  int iVar3;
  EPDFObjectType EVar4;
  PDFDictionary *this_00;
  longlong lVar5;
  PDFInteger *this_01;
  undefined4 extraout_var;
  LongFilePositionType LVar6;
  PDFDictionary *pPVar7;
  ObjectIDType inObjectID;
  unsigned_long inVersion;
  _Alloc_hider _Var8;
  PDFObjectParser *this_02;
  string token;
  string numberToken;
  string keywordToken;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string local_70;
  string local_50;
  
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  _Var8._M_p = (pointer)this;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  bVar2 = GetNextToken(this,&local_98);
  if (bVar2) {
    bVar2 = IsBoolean((PDFObjectParser *)_Var8._M_p,&local_98);
    __n = local_98._M_string_length;
    if (bVar2) {
      this_00 = (PDFDictionary *)ParseBoolean((PDFObjectParser *)_Var8._M_p,&local_98);
      goto LAB_001d0aa4;
    }
    if (local_98._M_string_length == 0) {
      if (scNull_abi_cxx11_._M_string_length == 0) {
LAB_001d082b:
        this_00 = (PDFDictionary *)operator_new(0x48);
        PDFNull::PDFNull((PDFNull *)this_00);
        goto LAB_001d0aa4;
      }
    }
    else {
      if (*local_98._M_dataplus._M_p == '<') {
        if ((local_98._M_string_length == 1) || (local_98._M_dataplus._M_p[1] != '<')) {
          this_00 = (PDFDictionary *)ParseHexadecimalString(this,&local_98);
          goto LAB_001d0aa4;
        }
      }
      else if (*local_98._M_dataplus._M_p == '(') {
        this_00 = (PDFDictionary *)ParseLiteralString(this,&local_98);
        goto LAB_001d0aa4;
      }
      if (scNull_abi_cxx11_._M_string_length == local_98._M_string_length) {
        if ((local_98._M_string_length == 0) ||
           (_Var8 = scNull_abi_cxx11_._M_dataplus,
           iVar3 = bcmp(scNull_abi_cxx11_._M_dataplus._M_p,local_98._M_dataplus._M_p,
                        local_98._M_string_length), iVar3 == 0)) goto LAB_001d082b;
      }
      else if (local_98._M_string_length == 0) goto LAB_001d0873;
      if (*local_98._M_dataplus._M_p == '/') {
        this_00 = (PDFDictionary *)ParseName(this,&local_98);
        goto LAB_001d0aa4;
      }
    }
LAB_001d0873:
    bVar2 = IsNumber((PDFObjectParser *)_Var8._M_p,&local_98);
    if (!bVar2) {
      if (scLeftSquare_abi_cxx11_._M_string_length == __n) {
        if ((__n == 0) ||
           (iVar3 = bcmp(scLeftSquare_abi_cxx11_._M_dataplus._M_p,local_98._M_dataplus._M_p,__n),
           iVar3 == 0)) {
          this_00 = (PDFDictionary *)ParseArray(this);
          goto LAB_001d0aa4;
        }
        if (scDoubleLeftAngle_abi_cxx11_._M_string_length == __n) {
LAB_001d0a0d:
          iVar3 = bcmp(scDoubleLeftAngle_abi_cxx11_._M_dataplus._M_p,local_98._M_dataplus._M_p,__n);
          if (iVar3 == 0) goto LAB_001d0a4b;
        }
      }
      else if (scDoubleLeftAngle_abi_cxx11_._M_string_length == __n) {
        if (__n != 0) goto LAB_001d0a0d;
LAB_001d0a4b:
        pPVar7 = (PDFDictionary *)ParseDictionary(this);
        if (pPVar7 != (PDFDictionary *)0x0) {
          bVar2 = GetNextToken(this,&local_98);
          this_00 = pPVar7;
          if (bVar2) {
            if ((scStream_abi_cxx11_._M_string_length == local_98._M_string_length) &&
               ((scStream_abi_cxx11_._M_string_length == 0 ||
                (iVar3 = bcmp(scStream_abi_cxx11_._M_dataplus._M_p,local_98._M_dataplus._M_p,
                              scStream_abi_cxx11_._M_string_length), iVar3 == 0)))) {
              this_00 = (PDFDictionary *)operator_new(0x58);
              iVar3 = (*this->mCurrentPositionProvider->_vptr_IReadPositionProvider[2])();
              LVar6 = PDFParserTokenizer::GetReadBufferSize(&this->mTokenizer);
              PDFStreamInput::PDFStreamInput
                        ((PDFStreamInput *)this_00,pPVar7,CONCAT44(extraout_var,iVar3) - LVar6);
            }
            else {
              SaveTokenToBuffer(this,&local_98);
            }
          }
          goto LAB_001d0aa4;
        }
        goto LAB_001d0aa2;
      }
      this_00 = (PDFDictionary *)operator_new(0x68);
      PDFSymbol::PDFSymbol((PDFSymbol *)this_00,&local_98);
      goto LAB_001d0aa4;
    }
    this_00 = (PDFDictionary *)ParseNumber((PDFObjectParser *)_Var8._M_p,&local_98);
    if (this_00 != (PDFDictionary *)0x0) {
      EVar4 = PDFObject::GetType((PDFObject *)this_00);
      if ((EVar4 != ePDFObjectInteger) ||
         (lVar5 = PDFInteger::GetValue((PDFInteger *)this_00), lVar5 < 1)) goto LAB_001d0aa4;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      this_02 = this;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      bVar2 = GetNextToken(this,&local_70);
      if (bVar2) {
        bVar2 = IsNumber(this_02,&local_70);
        if (bVar2) {
          this_01 = (PDFInteger *)ParseNumber(this_02,&local_70);
          if (((this_01 == (PDFInteger *)0x0) ||
              (EVar4 = PDFObject::GetType((PDFObject *)this_01), EVar4 != ePDFObjectInteger)) ||
             (lVar5 = PDFInteger::GetValue(this_01), lVar5 < 0)) {
            SaveTokenToBuffer(this,&local_70);
            if (this_01 == (PDFInteger *)0x0) goto LAB_001d0af6;
          }
          else {
            paVar1 = &local_50.field_2;
            local_50._M_string_length = 0;
            local_50.field_2._M_local_buf[0] = '\0';
            local_50._M_dataplus._M_p = (pointer)paVar1;
            bVar2 = GetNextToken(this,&local_50);
            if (bVar2) {
              if (local_50._M_string_length == scR_abi_cxx11_._M_string_length) {
                _Var8._M_p = local_50._M_dataplus._M_p;
                if (local_50._M_string_length != 0) {
                  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)local_50._M_dataplus._M_p;
                  iVar3 = bcmp(local_50._M_dataplus._M_p,scR_abi_cxx11_._M_dataplus._M_p,
                               local_50._M_string_length);
                  _Var8._M_p = (pointer)local_78;
                  if (iVar3 != 0) goto LAB_001d0995;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var8._M_p != paVar1) {
                  operator_delete(_Var8._M_p,
                                  CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                           local_50.field_2._M_local_buf[0]) + 1);
                }
                pPVar7 = (PDFDictionary *)operator_new(0x58);
                inObjectID = PDFInteger::GetValue((PDFInteger *)this_00);
                inVersion = PDFInteger::GetValue(this_01);
                PDFIndirectObjectReference::PDFIndirectObjectReference
                          ((PDFIndirectObjectReference *)pPVar7,inObjectID,inVersion);
                (*(this_00->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])(this_00);
                this_00 = pPVar7;
                goto LAB_001d0aed;
              }
LAB_001d0995:
              SaveTokenToBuffer(this,&local_70);
              SaveTokenToBuffer(this,&local_50);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p,
                              CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                       local_50.field_2._M_local_buf[0]) + 1);
            }
          }
LAB_001d0aed:
          (*(this_01->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])(this_01);
        }
        else {
          SaveTokenToBuffer(this,&local_70);
        }
      }
LAB_001d0af6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_001d0aa4;
    }
  }
LAB_001d0aa2:
  this_00 = (PDFDictionary *)0x0;
LAB_001d0aa4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return &this_00->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseNewObject()
{
	PDFObject* pdfObject = NULL;
	std::string token;

	do
	{
		if(!GetNextToken(token))
			break;

		// based on the parsed token, and perhaps some more, determine the type of object
		// and how to parse it.

		// Boolean
		if(IsBoolean(token))
		{
			pdfObject = ParseBoolean(token);
			break;
		} 
		// Literal String
		else if(IsLiteralString(token))
		{
			pdfObject = ParseLiteralString(token);
			break;
		}
		// Hexadecimal String
		else if(IsHexadecimalString(token))
		{
			pdfObject = ParseHexadecimalString(token);
			break;
		}
		// NULL
		else if (IsNull(token))
		{
			pdfObject = new PDFNull();
			break;
		}
		// Name
		else if(IsName(token))
		{
			pdfObject = ParseName(token);
			break;
		}
		// Number (and possibly an indirect reference)
		else if(IsNumber(token))
		{	
			pdfObject = ParseNumber(token);
			
			// this could be an indirect reference in case this is a positive integer
			// and the next one is also, and then there's an "R" keyword
			if(pdfObject && 
				(pdfObject->GetType() == PDFObject::ePDFObjectInteger) && 
				((PDFInteger*)pdfObject)->GetValue() > 0)
			{
				// try parse version
				std::string numberToken;
				if(!GetNextToken(numberToken)) // k. no next token...cant be reference
					break;

				if(!IsNumber(numberToken)) // k. no number, cant be reference
				{
					SaveTokenToBuffer(numberToken);
					break;
				}

				PDFObject* versionObject = ParseNumber(numberToken); 
				bool isReference = false;
				do
				{
					if(!versionObject || 
                       (versionObject->GetType() != PDFObject::ePDFObjectInteger) ||
						((PDFInteger*)versionObject)->GetValue() < 0) // k. failure to parse number, or no non-negative, cant be reference
					{
						SaveTokenToBuffer(numberToken);
						break;
					}

					// try parse R keyword
					std::string keywordToken;
					if(!GetNextToken(keywordToken)) // k. no next token...cant be reference
						break;

					if(keywordToken != scR) // k. not R...cant be reference
					{
						SaveTokenToBuffer(numberToken);
						SaveTokenToBuffer(keywordToken);
						break;
					}

					isReference = true;
				}while(false);

				// if passed all these, then this is a reference
				if(isReference)
				{
					PDFObject* referenceObject = new PDFIndirectObjectReference(
														(ObjectIDType)((PDFInteger*)pdfObject)->GetValue(),
														(unsigned long)((PDFInteger*)versionObject)->GetValue());
					delete pdfObject;
					pdfObject = referenceObject;
				}
				delete versionObject;
			}
			break;
		}
		// Array
		else if(IsArray(token))
		{
			pdfObject = ParseArray();
			break;
		}
		// Dictionary
		else if (IsDictionary(token))
		{
			pdfObject = ParseDictionary();

			if(pdfObject)
			{
				// could be a stream. will be if the next token is the "stream" keyword
				if(!GetNextToken(token))
					break;

				if(scStream == token) 
				{
					// yes, found a stream. record current position as the position where the stream starts. 
					// remove from the current stream position the size of the tokenizer buffer, which is "read", but not used
					pdfObject = new PDFStreamInput((PDFDictionary*)pdfObject, mCurrentPositionProvider->GetCurrentPosition() - mTokenizer.GetReadBufferSize());
				}
				else
				{
					SaveTokenToBuffer(token);
				}
			}

			break;
		}
		// Symbol (legitimate keyword or error. determine if error based on semantics)
		else
			pdfObject = new PDFSymbol(token);
	}while(false);


	return pdfObject;

}